

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

int ly_vlog_build_path_print
              (char **path,uint16_t *index,char *str,uint16_t str_len,uint16_t *length)

{
  uint16_t uVar1;
  char *pcVar2;
  ushort uVar3;
  uint uVar4;
  
  if (*index < str_len) {
    uVar3 = 0x80;
    if (0x80 < str_len) {
      uVar3 = str_len;
    }
    pcVar2 = (char *)realloc(*path,(ulong)((uint)*length + (uint)*index + (uint)uVar3 + 1));
    if (pcVar2 == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "ly_vlog_build_path_print");
      return -1;
    }
    *path = pcVar2;
    uVar4 = (uint)uVar3 + (uint)*index;
    memmove(pcVar2 + uVar4,pcVar2 + *index,(ulong)*length);
    *index = (uint16_t)uVar4;
  }
  uVar1 = *index;
  *index = uVar1 - str_len;
  memcpy(*path + (ushort)(uVar1 - str_len),str,(ulong)str_len);
  *length = *length + str_len;
  return 0;
}

Assistant:

static int
ly_vlog_build_path_print(char **path, uint16_t *index, const char *str, uint16_t str_len, uint16_t *length)
{
    void *mem;
    uint16_t step;

    if ((*index) < str_len) {
        /* enlarge buffer */
        step = (str_len < LY_BUF_STEP) ? LY_BUF_STEP : str_len;
        mem = realloc(*path, *length + *index + step + 1);
        LY_CHECK_ERR_RETURN(!mem, LOGMEM(NULL), -1);
        *path = mem;

        /* move data, lengths */
        memmove(&(*path)[*index + step], &(*path)[*index], *length);
        (*index) += step;
    }

    (*index) -= str_len;
    memcpy(&(*path)[*index], str, str_len);
    *length += str_len;

    return 0;
}